

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O1

coda_mem_array * coda_mem_array_new(coda_type_array *definition,coda_dynamic_type *attributes)

{
  long lVar1;
  coda_mem_array *type;
  coda_dynamic_type **ppcVar2;
  long lVar3;
  coda_mem_record *pcVar4;
  
  if (definition == (coda_type_array *)0x0) {
    coda_set_error(-100,"definition argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x24b);
    return (coda_mem_array *)0x0;
  }
  type = (coda_mem_array *)malloc(0x30);
  if (type == (coda_mem_array *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x30,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x252);
    return (coda_mem_array *)0x0;
  }
  type->backend = coda_backend_memory;
  type->definition = definition;
  definition->retain_count = definition->retain_count + 1;
  type->tag = tag_mem_array;
  type->attributes = attributes;
  type->num_elements = 0;
  type->element = (coda_dynamic_type **)0x0;
  if ((attributes == (coda_dynamic_type *)0x0) &&
     (definition->attributes != (coda_type_record *)0x0)) {
    pcVar4 = coda_mem_record_new(definition->attributes,(coda_dynamic_type *)0x0);
    type->attributes = (coda_dynamic_type *)pcVar4;
    if (pcVar4 == (coda_mem_record *)0x0) {
      coda_mem_type_delete((coda_dynamic_type *)type);
      return (coda_mem_array *)0x0;
    }
  }
  lVar1 = type->definition->num_elements;
  if (0 < lVar1) {
    ppcVar2 = (coda_dynamic_type **)malloc(lVar1 * 8);
    type->element = ppcVar2;
    if (ppcVar2 == (coda_dynamic_type **)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar1 * 8,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                     ,0x26d);
      coda_mem_type_delete((coda_dynamic_type *)type);
    }
    else {
      type->num_elements = lVar1;
      lVar3 = 0;
      do {
        type->element[lVar3] = (coda_dynamic_type *)0x0;
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
    if (ppcVar2 == (coda_dynamic_type **)0x0) {
      return (coda_mem_array *)0x0;
    }
    return type;
  }
  return type;
}

Assistant:

coda_mem_array *coda_mem_array_new(coda_type_array *definition, coda_dynamic_type *attributes)
{
    coda_mem_array *type;

    if (definition == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition argument is NULL (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    type = (coda_mem_array *)malloc(sizeof(coda_mem_array));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_mem_array), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_memory;
    type->definition = definition;
    definition->retain_count++;
    type->tag = tag_mem_array;
    type->attributes = attributes;
    type->num_elements = 0;
    type->element = NULL;

    if (attributes == NULL)
    {
        if (create_attributes_record((coda_mem_type *)type) != 0)
        {
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }
    if (type->definition->num_elements > 0)
    {
        long i;

        type->element = malloc(type->definition->num_elements * sizeof(coda_dynamic_type *));
        if (type->element == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           type->definition->num_elements * sizeof(coda_dynamic_type *), __FILE__, __LINE__);
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        type->num_elements = type->definition->num_elements;
        for (i = 0; i < type->num_elements; i++)
        {
            type->element[i] = NULL;
        }
    }

    return type;
}